

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

int nn_chunk_alloc(size_t size,int type,void **result)

{
  size_t sVar1;
  nn_chunk *self_00;
  void *pvVar2;
  undefined8 *in_RDX;
  int in_ESI;
  size_t in_RDI;
  size_t hdrsz;
  nn_chunk *self;
  size_t sz;
  int local_4;
  
  sVar1 = nn_chunk_hdrsize();
  if (sVar1 + in_RDI < sVar1) {
    local_4 = -0xc;
  }
  else if (in_ESI == 0) {
    self_00 = (nn_chunk *)nn_alloc_(0x139513);
    if (self_00 == (nn_chunk *)0x0) {
      local_4 = -0xc;
    }
    else {
      nn_atomic_init((nn_atomic *)self_00,1);
      self_00->size = in_RDI;
      self_00->ffn = nn_chunk_default_free;
      nn_putl((uint8_t *)(self_00 + 1),0);
      nn_putl(&self_00[1].field_0x4,0xdeadcafe);
      pvVar2 = nn_chunk_getdata(self_00);
      *in_RDX = pvVar2;
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int nn_chunk_alloc (size_t size, int type, void **result)
{
    size_t sz;
    struct nn_chunk *self;
    const size_t hdrsz = nn_chunk_hdrsize ();

    /*  Compute total size to be allocated. Check for overflow. */
    sz = hdrsz + size;
    if (nn_slow (sz < hdrsz))
        return -ENOMEM;

    /*  Allocate the actual memory depending on the type. */
    switch (type) {
    case 0:
        self = nn_alloc (sz, "message chunk");
        break;
    default:
        return -EINVAL;
    }
    if (nn_slow (!self))
        return -ENOMEM;

    /*  Fill in the chunk header. */
    nn_atomic_init (&self->refcount, 1);
    self->size = size;
    self->ffn = nn_chunk_default_free;

    /*  Fill in the size of the empty space between the chunk header
        and the message. */
    nn_putl ((uint8_t*) ((uint32_t*) (self + 1)), 0);

    /*  Fill in the tag. */
    nn_putl ((uint8_t*) ((((uint32_t*) (self + 1))) + 1), NN_CHUNK_TAG);

    *result = nn_chunk_getdata (self);
    return 0;
}